

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_extension_instances
               (lyout *out,int level,lys_module *module,LYEXT_SUBSTMT substmt,uint8_t substmt_index,
               lys_ext_instance **ext,uint count)

{
  uint8_t *puVar1;
  long lVar2;
  byte bVar3;
  ushort uVar4;
  lys_ext_instance *plVar5;
  lys_ext *plVar6;
  undefined8 uVar7;
  lys_module *module_00;
  ulong uVar8;
  int iVar9;
  LY_STMT LVar10;
  lys_module *plVar11;
  lys_module *plVar12;
  ulong uVar13;
  undefined8 *puVar14;
  long *plVar15;
  char **ppcVar16;
  lys_ext_instance_complex *plVar17;
  lys_restr *restr;
  LYEXT_SUBSTMT LVar18;
  long lVar19;
  lyout *plVar20;
  undefined4 in_register_00000034;
  undefined7 in_register_00000081;
  char *pcVar21;
  lys_ext_instance **pplVar22;
  char *pcVar23;
  ulong uVar24;
  long *plVar25;
  int iVar26;
  lys_node *node;
  uint8_t uVar27;
  uint uVar28;
  uint16_t val1;
  uint16_t val2;
  int *content_00;
  lyext_substmt *local_c0;
  long local_b8;
  char **local_b0;
  uint local_a4;
  undefined8 local_a0;
  char *local_98;
  ulong local_90;
  uint local_84;
  lys_ext *local_80;
  uint local_78;
  LYEXT_SUBSTMT local_74;
  ulong local_70;
  long *local_68;
  int local_5c;
  lys_module *local_58;
  lys_ext_instance **local_50;
  ulong local_48;
  lyout *local_40;
  int local_38;
  int local_34 [2];
  int content;
  
  local_a0 = CONCAT44(in_register_00000034,level);
  if (count != 0) {
    uVar24 = CONCAT71(in_register_00000081,substmt_index) & 0xffffffff;
    local_b0 = &module->prefix;
    local_84 = level * 2;
    local_78 = level * 2 + 2;
    local_38 = level + 1;
    local_5c = level + 2;
    uVar13 = (ulong)count;
    local_48 = 0;
    local_98 = (char *)0x0;
    local_a4 = (uint)CONCAT71(in_register_00000081,substmt_index);
    local_90 = uVar13;
    local_74 = substmt;
    local_58 = module;
    local_50 = ext;
    local_40 = out;
    do {
      plVar5 = ext[local_48];
      if ((((plVar5->flags & 1) == 0) && ((uint)plVar5->insubstmt == substmt)) &&
         (plVar5->insubstmt_index == (uint8_t)uVar24)) {
        plVar11 = plVar5->def->module;
        if (plVar11 == *(local_58->ctx->models).list) {
          pcVar21 = plVar5->arg_value;
          iVar9 = strcmp(pcVar21,"operation");
          uVar13 = local_90;
          substmt = local_74;
          if (((iVar9 == 0) ||
              (iVar9 = strcmp(pcVar21,"select"), uVar13 = local_90, substmt = local_74, iVar9 == 0))
             || (iVar9 = strcmp(pcVar21,"type"), uVar13 = local_90, substmt = local_74, iVar9 == 0))
          goto LAB_0017d42d;
        }
        module_00 = local_58;
        plVar11 = lys_main_module(plVar11);
        content_00 = (int *)0x17b70b;
        plVar12 = lys_main_module(module_00);
        plVar20 = local_40;
        ppcVar16 = local_b0;
        if (plVar11 == plVar12) {
LAB_0017b745:
          pcVar21 = *ppcVar16;
        }
        else {
          uVar13 = (ulong)module_00->imp_size;
          pcVar21 = local_98;
          if (uVar13 != 0) {
            ppcVar16 = &module_00->imp->prefix;
            do {
              if (plVar11 == (lys_module *)ppcVar16[-1]) goto LAB_0017b745;
              ppcVar16 = ppcVar16 + 7;
              uVar13 = uVar13 - 1;
            } while (uVar13 != 0);
          }
        }
        if (pcVar21 == (char *)0x0) {
          __assert_fail("prefix",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/printer_yin.c"
                        ,0x7ad,
                        "void yin_print_extension_instances(struct lyout *, int, const struct lys_module *, LYEXT_SUBSTMT, uint8_t, struct lys_ext_instance **, unsigned int)"
                       );
        }
        local_34[0] = 0;
        plVar6 = ext[local_48]->def;
        pcVar23 = ext[local_48]->arg_value;
        local_98 = pcVar21;
        if (pcVar23 == (char *)0x0) {
          content_00 = (int *)0x17b81e;
          ly_print(local_40,"%*s<%s:%s",(ulong)local_84,"",pcVar21,plVar6->name);
        }
        else if ((plVar6->flags & 1) == 0) {
          yin_print_open(local_40,(int)local_a0,pcVar21,plVar6->name,plVar6->argument,pcVar23,0);
        }
        else {
          local_34[0] = 1;
          ly_print(local_40,"%*s<%s:%s",(ulong)local_84,"",pcVar21,plVar6->name);
          ly_print(plVar20,">\n");
          uVar13 = local_48;
          ly_print(plVar20,"%*s<%s:%s>",(ulong)local_78,"",pcVar21,ext[local_48]->def->argument);
          lyxml_dump_text(plVar20,ext[uVar13]->arg_value);
          content_00 = (int *)0x17b8c3;
          ly_print(plVar20,"</%s:%s>\n",pcVar21,ext[uVar13]->def->argument);
        }
        plVar20 = local_40;
        if (ext[local_48]->ext_size != '\0') {
          if (local_34[0] == 0) {
            local_34[0] = 1;
            content_00 = (int *)0x17b8f3;
            ly_print(local_40,">\n");
          }
          yin_print_extension_instances
                    (plVar20,local_38,local_58,LYEXT_SUBSTMT_SELF,'\0',ext[local_48]->ext,
                     (uint)ext[local_48]->ext_size);
        }
        if ((ext[local_48]->ext_type == '\x01') &&
           (local_80 = ext[local_48][1].def, local_80 != (lys_ext *)0x0)) {
          local_b8 = 0;
          do {
            plVar20 = local_40;
            pplVar22 = local_50;
            plVar11 = local_58;
            LVar18 = *(LYEXT_SUBSTMT *)(local_80->padding + local_b8 * 0x18 + -0x1b);
            if (0x37 < (uint)LVar18) goto switchD_0017b972_caseD_13;
            puVar1 = local_80->padding + local_b8 * 0x18 + -0x1b;
            switch(LVar18) {
            case LYEXT_SUBSTMT_SELF:
              goto switchD_0017b972_caseD_0;
            case LYEXT_SUBSTMT_ARGUMENT:
              content_00 = (int *)0x17c001;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_ARGUMENT,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (*plVar15 != 0)) {
                if (local_34[0] == 0) {
                  local_34[0] = 1;
                  content_00 = (int *)0x17c039;
                  ly_print(local_40,">\n");
                }
                local_68 = plVar15;
                if (*(uint *)&local_80->ref < 2) {
                  iVar26 = 0;
                  yin_print_open(plVar20,local_38,(char *)0x0,"argument","name",(char *)*plVar15,0);
                  iVar9 = lys_ext_iter(local_50[local_48]->ext,local_50[local_48]->ext_size,'\0',
                                       LYEXT_SUBSTMT_ARGUMENT);
                  if (iVar9 != -1) {
                    iVar26 = 0;
                    do {
                      if (iVar26 == 0) {
                        ly_print(local_40,">\n");
                        iVar26 = 1;
                      }
                      uVar13 = local_48;
                      pplVar22 = local_50;
                      yin_print_extension_instances
                                (local_40,local_5c,local_58,LYEXT_SUBSTMT_ARGUMENT,'\0',
                                 local_50[local_48]->ext + iVar9,1);
                      iVar9 = lys_ext_iter(pplVar22[uVar13]->ext,pplVar22[uVar13]->ext_size,
                                           (char)iVar9 + '\x01',LYEXT_SUBSTMT_ARGUMENT);
                    } while (iVar9 != -1);
                  }
                  pplVar22 = local_50;
                  plVar15 = local_68;
                  if (((char)local_68[1] == '\x01') ||
                     (iVar9 = lys_ext_iter(local_50[local_48]->ext,local_50[local_48]->ext_size,'\0'
                                           ,LYEXT_SUBSTMT_YINELEM), plVar20 = local_40, iVar9 != -1)
                     ) {
                    plVar20 = local_40;
                    if (iVar26 == 0) {
                      ly_print(local_40,">\n");
                      iVar26 = 1;
                    }
                    pcVar21 = "false";
                    if ((char)plVar15[1] == '\x01') {
                      pcVar21 = "true";
                    }
                    yin_print_substmt(plVar20,local_5c,LYEXT_SUBSTMT_YINELEM,'\0',pcVar21,local_58,
                                      pplVar22[local_48]->ext,(uint)pplVar22[local_48]->ext_size);
                  }
                  content_00 = (int *)0x17cfb6;
                  yin_print_close(plVar20,local_38,(char *)0x0,"argument",iVar26);
                }
                else {
                  pcVar21 = *(char **)*plVar15;
                  if (pcVar21 != (char *)0x0) {
                    uVar13 = 0;
                    do {
                      yin_print_open(local_40,local_38,(char *)0x0,"argument","name",pcVar21,0);
                      pplVar22 = local_50;
                      iVar9 = -1;
                      local_70 = local_70 & 0xffffffff00000000;
                      uVar24 = local_48;
                      while( true ) {
                        iVar9 = lys_ext_iter(pplVar22[uVar24]->ext,pplVar22[uVar24]->ext_size,
                                             (char)iVar9 + '\x01',LYEXT_SUBSTMT_ARGUMENT);
                        plVar20 = local_40;
                        uVar8 = local_48;
                        plVar15 = local_68;
                        uVar27 = (uint8_t)uVar13;
                        if (iVar9 == -1) break;
                        if (uVar13 == pplVar22[uVar24]->ext[iVar9]->insubstmt_index) {
                          if ((int)local_70 == 0) {
                            ly_print(local_40,">\n");
                            local_70 = CONCAT44(local_70._4_4_,1);
                            uVar24 = local_48;
                          }
                          yin_print_extension_instances
                                    (local_40,local_5c,local_58,LYEXT_SUBSTMT_ARGUMENT,uVar27,
                                     pplVar22[uVar24]->ext + iVar9,1);
                          uVar24 = local_48;
                        }
                      }
                      if (*(char *)(local_68[1] + uVar13) == '\x01') {
                        if ((int)local_70 == 0) {
                          ly_print(local_40,">\n");
                          local_70 = CONCAT44(local_70._4_4_,1);
                        }
                        pcVar21 = "false";
                        if (*(char *)(plVar15[1] + uVar13) == '\x01') {
                          pcVar21 = "true";
                        }
                        yin_print_substmt(plVar20,local_5c,LYEXT_SUBSTMT_YINELEM,uVar27,pcVar21,
                                          local_58,pplVar22[local_48]->ext,
                                          (uint)pplVar22[local_48]->ext_size);
                      }
                      else {
                        iVar9 = -1;
                        do {
                          iVar9 = lys_ext_iter(pplVar22[uVar8]->ext,pplVar22[uVar8]->ext_size,
                                               (char)iVar9 + '\x01',LYEXT_SUBSTMT_YINELEM);
                          plVar15 = local_68;
                          plVar20 = local_40;
                          if (iVar9 == -1) goto LAB_0017c2a1;
                        } while (uVar13 != pplVar22[uVar8]->ext[iVar9]->insubstmt_index);
                        if ((int)local_70 == 0) {
                          ly_print(local_40,">\n");
                          local_70 = CONCAT44(local_70._4_4_,1);
                        }
                        plVar20 = local_40;
                        plVar15 = local_68;
                        pcVar21 = "false";
                        if (*(char *)(local_68[1] + uVar13) == '\x01') {
                          pcVar21 = "true";
                        }
                        yin_print_substmt(local_40,local_5c,LYEXT_SUBSTMT_YINELEM,uVar27,pcVar21,
                                          local_58,local_50[local_48]->ext + iVar9,
                                          (uint)local_50[local_48]->ext_size - iVar9);
                      }
LAB_0017c2a1:
                      content_00 = (int *)0x17c2b9;
                      yin_print_close(plVar20,local_38,(char *)0x0,"argument",(int)local_70);
                      pcVar21 = *(char **)(*plVar15 + 8 + uVar13 * 8);
                      uVar13 = uVar13 + 1;
                    } while (pcVar21 != (char *)0x0);
                  }
                }
              }
              break;
            default:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              content_00 = (int *)0x17b992;
              plVar15 = (long *)lys_ext_complex_get_substmt(LVar18,plVar17,&local_c0);
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if (local_c0->cardinality < LY_STMT_CARD_SOME) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  pcVar21 = (char *)*plVar15;
                  bVar3 = plVar17->ext_size;
                  pplVar22 = plVar17->ext;
                  plVar20 = local_40;
                  plVar11 = local_58;
                  goto LAB_0017bad5;
                }
                if (*plVar25 != 0) {
                  lVar19 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    content_00 = (int *)(ulong)plVar17->ext_size;
                    yin_print_substmt(local_40,local_38,LVar18,(uint8_t)lVar19,
                                      (char *)plVar25[lVar19],local_58,plVar17->ext,
                                      (uint)plVar17->ext_size);
                    lVar2 = lVar19 + 1;
                    lVar19 = lVar19 + 1;
                  } while (plVar25[lVar2] != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_BELONGSTO:
              content_00 = (int *)0x17c6a0;
              local_68 = (long *)lys_ext_complex_get_substmt
                                           (LY_STMT_BELONGSTO,
                                            (lys_ext_instance_complex *)local_50[local_48],
                                            (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((local_68 != (long *)0x0) && (*local_68 != 0)) {
                if (*(uint *)&local_80->ref < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  yin_print_open(plVar20,local_38,(char *)0x0,"belongs-to","module",
                                 (char *)*local_68,1);
                  uVar13 = local_48;
                  pplVar22 = local_50;
                  iVar9 = lys_ext_iter(local_50[local_48]->ext,local_50[local_48]->ext_size,'\0',
                                       LYEXT_SUBSTMT_BELONGSTO);
                  plVar11 = local_58;
                  iVar26 = local_5c;
                  plVar20 = local_40;
                  while (local_40 = plVar20, iVar9 != -1) {
                    yin_print_extension_instances
                              (plVar20,iVar26,plVar11,LYEXT_SUBSTMT_BELONGSTO,'\0',
                               pplVar22[uVar13]->ext + iVar9,1);
                    pplVar22 = local_50;
                    iVar9 = lys_ext_iter(local_50[uVar13]->ext,local_50[uVar13]->ext_size,
                                         (char)iVar9 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                    plVar20 = local_40;
                  }
                  yin_print_substmt(plVar20,iVar26,LYEXT_SUBSTMT_PREFIX,'\0',(char *)local_68[1],
                                    plVar11,pplVar22[uVar13]->ext,(uint)pplVar22[uVar13]->ext_size);
                  content_00 = (int *)0x17d192;
                  ly_print(plVar20,"%*s</%s>\n",(ulong)local_78,"");
                }
                else if (*(long *)*local_68 != 0) {
                  uVar13 = 0;
                  do {
                    plVar20 = local_40;
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    yin_print_open(plVar20,local_38,(char *)0x0,"belongs-to","module",
                                   *(char **)(*local_68 + uVar13 * 8),1);
                    uVar8 = local_48;
                    pplVar22 = local_50;
                    local_70 = uVar13;
                    iVar9 = lys_ext_iter(local_50[local_48]->ext,local_50[local_48]->ext_size,'\0',
                                         LYEXT_SUBSTMT_BELONGSTO);
                    plVar11 = local_58;
                    iVar26 = local_5c;
                    uVar24 = local_70;
                    while (local_70._0_1_ = (uint8_t)uVar24, local_70 = uVar24, iVar9 != -1) {
                      uVar27 = (uint8_t)local_70;
                      yin_print_extension_instances
                                (plVar20,iVar26,plVar11,LYEXT_SUBSTMT_BELONGSTO,uVar27,
                                 pplVar22[uVar8]->ext + iVar9,1);
                      pplVar22 = local_50;
                      iVar9 = lys_ext_iter(local_50[uVar8]->ext,local_50[uVar8]->ext_size,
                                           (char)iVar9 + '\x01',LYEXT_SUBSTMT_BELONGSTO);
                      uVar24 = local_70;
                    }
                    uVar27 = (uint8_t)local_70;
                    yin_print_substmt(plVar20,iVar26,LYEXT_SUBSTMT_PREFIX,uVar27,
                                      *(char **)(local_68[1] + uVar24 * 8),plVar11,
                                      pplVar22[uVar8]->ext,(uint)pplVar22[uVar8]->ext_size);
                    content_00 = (int *)0x17c81d;
                    ly_print(plVar20,"%*s</%s>\n",(ulong)local_78,"");
                    uVar13 = uVar24 + 1;
                  } while (*(long *)(*local_68 + 8 + uVar24 * 8) != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_VALUE:
              plVar5 = local_50[local_48];
              uVar7 = *(undefined8 *)(puVar1 + 8);
              if (*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    content_00 = (int *)0x17cc4b;
                    ly_print(local_40,">\n");
                  }
                  yin_print_signed(local_40,local_38,LYEXT_SUBSTMT_SELF,(uint8_t)local_58,
                                   (lys_module *)local_50[local_48]->ext,
                                   (lys_ext_instance **)(ulong)local_50[local_48]->ext_size,
                                   **(uint **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                   ,(int)content_00);
                }
                else if (**(long **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                  lVar19 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      content_00 = (int *)0x17be58;
                      ly_print(local_40,">\n");
                    }
                    yin_print_signed(local_40,local_38,(LYEXT_SUBSTMT)lVar19 & 0xff,
                                     (uint8_t)local_58,(lys_module *)local_50[local_48]->ext,
                                     (lys_ext_instance **)(ulong)local_50[local_48]->ext_size,
                                     **(uint **)(*(long *)((long)&plVar5[1].arg_value +
                                                          uVar7 + LY_STMT_CONTACT) + lVar19 * 8),
                                     (int)content_00);
                    lVar2 = lVar19 * 8;
                    lVar19 = lVar19 + 1;
                  } while (*(long *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                     + 8 + lVar2) != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_VERSION:
            case LYEXT_SUBSTMT_YINELEM:
              break;
            case LYEXT_SUBSTMT_MODIFIER:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              pcVar21 = "invert-match";
              LVar18 = LYEXT_SUBSTMT_MODIFIER;
              pcVar23 = (char *)0x0;
              goto LAB_0017c3c4;
            case LYEXT_SUBSTMT_REQINSTANCE:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              pcVar21 = "true";
              pcVar23 = "false";
LAB_0017c3c4:
              content_00 = local_34;
              yin_print_extcomplex_bool
                        (local_40,local_38,local_58,plVar17,LVar18,pcVar21,pcVar23,content_00);
              break;
            case LYEXT_SUBSTMT_CONFIG:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              pcVar23 = "false";
              pcVar21 = "true";
              LVar10 = LY_STMT_CONFIG;
              val2 = 6;
              val1 = 5;
              goto LAB_0017c53f;
            case LYEXT_SUBSTMT_MANDATORY:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              pcVar23 = "true";
              pcVar21 = "false";
              LVar10 = LY_STMT_MANDATORY;
              val2 = 0x40;
              val1 = 0x80;
              goto LAB_0017c53f;
            case LYEXT_SUBSTMT_ORDEREDBY:
              plVar17 = (lys_ext_instance_complex *)local_50[local_48];
              pcVar23 = "user";
              pcVar21 = "system";
              LVar10 = LY_STMT_ORDEREDBY;
              val2 = 0x100;
              val1 = 0;
LAB_0017c53f:
              content_00 = local_34;
              yin_print_extcomplex_flags
                        (local_40,local_38,local_58,plVar17,LVar10,pcVar21,pcVar23,val1,val2,
                         content_00);
              break;
            case LYEXT_SUBSTMT_STATUS:
              uVar4 = *(ushort *)
                       ((long)&local_50[local_48][1].arg_value +
                       *(undefined8 *)(puVar1 + 8) + LY_STMT_CONTACT);
              if (uVar4 != 0) {
                if ((uVar4 & 8) == 0) {
                  if ((uVar4 & 0x10) == 0) {
                    if ((uVar4 & 0x20) == 0) break;
                    if (local_34[0] == 0) {
                      pcVar21 = "obsolete";
                      goto LAB_0017d3b1;
                    }
                    pcVar21 = "obsolete";
                  }
                  else {
                    if (local_34[0] == 0) {
                      pcVar21 = "deprecated";
                      goto LAB_0017d3b1;
                    }
                    pcVar21 = "deprecated";
                  }
                }
                else if (local_34[0] == 0) {
                  pcVar21 = "current";
LAB_0017d3b1:
                  local_34[0] = 1;
                  ly_print(local_40,">\n");
                }
                else {
                  pcVar21 = "current";
                }
                bVar3 = pplVar22[local_48]->ext_size;
                LVar18 = LYEXT_SUBSTMT_STATUS;
                pplVar22 = pplVar22[local_48]->ext;
LAB_0017bad5:
                content_00 = (int *)(ulong)bVar3;
                yin_print_substmt(plVar20,local_38,LVar18,'\0',pcVar21,plVar11,pplVar22,(uint)bVar3)
                ;
              }
              break;
            case LYEXT_SUBSTMT_DIGITS:
              plVar5 = local_50[local_48];
              uVar7 = *(undefined8 *)(puVar1 + 8);
              if ((*(uint *)&local_80->ref < 2) ||
                 (*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) == 0)) {
                if (*(char *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != '\0') {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  pplVar22 = local_50[local_48]->ext;
                  uVar28 = (uint)local_50[local_48]->ext_size;
                  content_00 = (int *)(ulong)*(byte *)((long)&plVar5[1].arg_value +
                                                      uVar7 + LY_STMT_CONTACT);
                  LVar18 = LYEXT_SUBSTMT_DIGITS;
LAB_0017cd39:
                  yin_print_unsigned(plVar20,local_38,LVar18,'\0',local_58,pplVar22,uVar28,
                                     (uint)content_00);
                }
              }
              else if (**(char **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != '\0') {
                lVar19 = 0;
                do {
                  plVar20 = local_40;
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  bVar3 = *(byte *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                   + lVar19);
                  content_00 = (int *)(ulong)bVar3;
                  yin_print_unsigned(plVar20,local_38,LYEXT_SUBSTMT_DIGITS,(uint8_t)lVar19,local_58,
                                     local_50[local_48]->ext,(uint)local_50[local_48]->ext_size,
                                     (uint)bVar3);
                  pcVar21 = (char *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                     + 1 + lVar19);
                  lVar19 = lVar19 + 1;
                } while (*pcVar21 != '\0');
              }
              break;
            case LYEXT_SUBSTMT_MAX:
              plVar5 = local_50[local_48];
              uVar7 = *(undefined8 *)(puVar1 + 8);
              if (*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  pplVar22 = local_50[local_48]->ext;
                  uVar28 = (uint)local_50[local_48]->ext_size;
                  content_00 = (int *)(ulong)**(uint **)((long)&plVar5[1].arg_value +
                                                        uVar7 + LY_STMT_CONTACT);
                  LVar18 = LYEXT_SUBSTMT_MAX;
                  plVar20 = local_40;
                  goto LAB_0017cd39;
                }
                if (**(long **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                  lVar19 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    uVar28 = **(uint **)(*(long *)((long)&plVar5[1].arg_value +
                                                  uVar7 + LY_STMT_CONTACT) + lVar19 * 8);
                    content_00 = (int *)(ulong)uVar28;
                    yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_MAX,(uint8_t)lVar19,local_58,
                                       local_50[local_48]->ext,(uint)local_50[local_48]->ext_size,
                                       uVar28);
                    lVar2 = lVar19 * 8;
                    lVar19 = lVar19 + 1;
                  } while (*(long *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                     + 8 + lVar2) != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_MIN:
              plVar5 = local_50[local_48];
              uVar7 = *(undefined8 *)(puVar1 + 8);
              if (*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  pplVar22 = local_50[local_48]->ext;
                  uVar28 = (uint)local_50[local_48]->ext_size;
                  content_00 = (int *)(ulong)**(uint **)((long)&plVar5[1].arg_value +
                                                        uVar7 + LY_STMT_CONTACT);
                  LVar18 = LYEXT_SUBSTMT_MIN;
                  plVar20 = local_40;
                  goto LAB_0017cd39;
                }
                if (**(long **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                  lVar19 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    uVar28 = **(uint **)(*(long *)((long)&plVar5[1].arg_value +
                                                  uVar7 + LY_STMT_CONTACT) + lVar19 * 8);
                    content_00 = (int *)(ulong)uVar28;
                    yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_MIN,(uint8_t)lVar19,local_58,
                                       local_50[local_48]->ext,(uint)local_50[local_48]->ext_size,
                                       uVar28);
                    lVar2 = lVar19 * 8;
                    lVar19 = lVar19 + 1;
                  } while (*(long *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                     + 8 + lVar2) != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_POSITION:
              plVar5 = local_50[local_48];
              uVar7 = *(undefined8 *)(puVar1 + 8);
              if (*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  pplVar22 = local_50[local_48]->ext;
                  uVar28 = (uint)local_50[local_48]->ext_size;
                  content_00 = (int *)(ulong)**(uint **)((long)&plVar5[1].arg_value +
                                                        uVar7 + LY_STMT_CONTACT);
                  LVar18 = LYEXT_SUBSTMT_POSITION;
                  plVar20 = local_40;
                  goto LAB_0017cd39;
                }
                if (**(long **)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT) != 0) {
                  lVar19 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    uVar28 = **(uint **)(*(long *)((long)&plVar5[1].arg_value +
                                                  uVar7 + LY_STMT_CONTACT) + lVar19 * 8);
                    content_00 = (int *)(ulong)uVar28;
                    yin_print_unsigned(local_40,local_38,LYEXT_SUBSTMT_POSITION,(uint8_t)lVar19,
                                       local_58,local_50[local_48]->ext,
                                       (uint)local_50[local_48]->ext_size,uVar28);
                    lVar2 = lVar19 * 8;
                    lVar19 = lVar19 + 1;
                  } while (*(long *)(*(long *)((long)&plVar5[1].arg_value + uVar7 + LY_STMT_CONTACT)
                                     + 8 + lVar2) != 0);
                }
              }
              break;
            case LYEXT_SUBSTMT_UNIQUE:
              content_00 = (int *)0x17c858;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_UNIQUE,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  yin_print_unique(plVar20,local_38,(lys_unique *)*plVar15);
                  iVar26 = 0;
                  iVar9 = lys_ext_iter(local_50[local_48]->ext,local_50[local_48]->ext_size,'\0',
                                       LYEXT_SUBSTMT_UNIQUE);
                  if (iVar9 != -1) {
                    iVar26 = 0;
                    do {
                      if (iVar26 == 0) {
                        ly_print(local_40,">\n");
                        iVar26 = 1;
                      }
                      uVar13 = local_48;
                      pplVar22 = local_50;
                      yin_print_extension_instances
                                (local_40,local_5c,local_58,LYEXT_SUBSTMT_UNIQUE,'\0',
                                 local_50[local_48]->ext + iVar9,1);
                      iVar9 = lys_ext_iter(pplVar22[uVar13]->ext,pplVar22[uVar13]->ext_size,
                                           (char)iVar9 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                    } while (iVar9 != -1);
                  }
                  content_00 = (int *)0x17d28e;
                  yin_print_close(local_40,local_38,(char *)0x0,"unique",iVar26);
                }
                else if (*plVar25 != 0) {
                  uVar28 = 0;
                  do {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    yin_print_unique(local_40,local_38,(lys_unique *)*plVar25);
                    uVar13 = local_48;
                    pplVar22 = local_50;
                    iVar9 = -1;
                    while (iVar9 = lys_ext_iter(pplVar22[uVar13]->ext,pplVar22[uVar13]->ext_size,
                                                (char)iVar9 + '\x01',LYEXT_SUBSTMT_UNIQUE),
                          iVar9 != -1) {
                      if (uVar28 == pplVar22[uVar13]->ext[iVar9]->insubstmt_index) {
                        ly_print(local_40,">\n");
                        uVar13 = local_48;
                        do {
                          yin_print_extension_instances
                                    (local_40,local_5c,local_58,LYEXT_SUBSTMT_UNIQUE,(uint8_t)uVar28
                                     ,pplVar22[uVar13]->ext + iVar9,1);
                          uVar13 = local_48;
                          do {
                            iVar9 = lys_ext_iter(pplVar22[uVar13]->ext,pplVar22[uVar13]->ext_size,
                                                 (char)iVar9 + '\x01',LYEXT_SUBSTMT_UNIQUE);
                            if (iVar9 == -1) {
                              iVar9 = 1;
                              goto LAB_0017c9a9;
                            }
                          } while (uVar28 != pplVar22[uVar13]->ext[iVar9]->insubstmt_index);
                        } while( true );
                      }
                    }
                    iVar9 = 0;
LAB_0017c9a9:
                    content_00 = (int *)0x17c9be;
                    yin_print_close(local_40,local_38,(char *)0x0,"unique",iVar9);
                    uVar28 = uVar28 + 1;
                    plVar15 = plVar25 + 1;
                    plVar25 = plVar25 + 1;
                  } while (*plVar15 != 0);
                }
              }
              break;
            case 0x20:
              content_00 = (int *)0x17ca8a;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_MODULE,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17d30a;
                  yin_print_model_(plVar20,local_38,(lys_module *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17caec;
                    yin_print_model_(plVar20,local_38,(lys_module *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0x29:
            case 0x2a:
            case 0x2b:
            case 0x2c:
            case 0x2d:
            case 0x2e:
              content_00 = (int *)0x17ba39;
              puVar14 = (undefined8 *)
                        lys_ext_complex_get_substmt
                                  (LVar18,(lys_ext_instance_complex *)local_50[local_48],
                                   (lyext_substmt **)0x0);
              if (puVar14 != (undefined8 *)0x0) {
                for (node = (lys_node *)*puVar14; node != (lys_node *)0x0; node = node->next) {
                  content_00 = (int *)0x17ba57;
                  LVar10 = lys_snode2stmt(node->nodetype);
                  plVar20 = local_40;
                  if (LVar10 == *(LY_STMT *)puVar1) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(local_40,">\n");
                    }
                    content_00 = (int *)0x17ba91;
                    yin_print_snode(plVar20,local_38,node,0xffff);
                  }
                }
              }
              break;
            case 0x2f:
              content_00 = (int *)0x17bc18;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_TYPEDEF,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17cdf5;
                  yin_print_typedef(plVar20,local_38,local_58,(lys_tpdf *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17bc7e;
                    yin_print_typedef(plVar20,local_38,local_58,(lys_tpdf *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x30:
              content_00 = (int *)0x17c567;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_TYPE,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17d061;
                  yin_print_type(plVar20,local_38,local_58,(lys_type *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17c5cd;
                    yin_print_type(plVar20,local_38,local_58,(lys_type *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x31:
              content_00 = (int *)0x17baf7;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_IFFEATURE,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17cd8e;
                  yin_print_iffeature(plVar20,local_38,local_58,(lys_iffeature *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17bb5d;
                    yin_print_iffeature(plVar20,local_38,local_58,(lys_iffeature *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x32:
              content_00 = (int *)0x17bb84;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_LENGTH,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  restr = (lys_restr *)*plVar15;
                  pcVar21 = "length";
LAB_0017d2c6:
                  content_00 = (int *)0x17d2d5;
                  yin_print_typerestr(plVar20,local_38,local_58,restr,pcVar21);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17bbf1;
                    yin_print_typerestr(plVar20,local_38,local_58,(lys_restr *)*plVar25,"length");
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x33:
              content_00 = (int *)0x17c2eb;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_MUST,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17cfef;
                  yin_print_must(plVar20,local_38,local_58,(lys_restr *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17c351;
                    yin_print_must(plVar20,local_38,local_58,(lys_restr *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x34:
              content_00 = (int *)0x17c9f6;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_PATTERN,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  restr = (lys_restr *)*plVar15;
                  pcVar21 = "pattern";
                  goto LAB_0017d2c6;
                }
                lVar19 = *plVar25;
                while (local_40 = plVar20, lVar19 != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar20,">\n");
                  }
                  content_00 = (int *)0x17ca63;
                  yin_print_typerestr(plVar20,local_38,local_58,(lys_restr *)*plVar25,"pattern");
                  lVar19 = plVar25[1];
                  plVar25 = plVar25 + 1;
                  plVar20 = local_40;
                }
              }
              break;
            case 0x35:
              content_00 = (int *)0x17bca5;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_RANGE,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  restr = (lys_restr *)*plVar15;
                  pcVar21 = "range";
                  goto LAB_0017d2c6;
                }
                lVar19 = *plVar25;
                while (local_40 = plVar20, lVar19 != 0) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(plVar20,">\n");
                  }
                  content_00 = (int *)0x17bd12;
                  yin_print_typerestr(plVar20,local_38,local_58,(lys_restr *)*plVar25,"range");
                  lVar19 = plVar25[1];
                  plVar25 = plVar25 + 1;
                  plVar20 = local_40;
                }
              }
              break;
            case 0x36:
              content_00 = (int *)0x17cb13;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_WHEN,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17d343;
                  yin_print_when(plVar20,local_38,local_58,(lys_when *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17cb79;
                    yin_print_when(plVar20,local_38,local_58,(lys_when *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
              break;
            case 0x37:
              content_00 = (int *)0x17c493;
              plVar15 = (long *)lys_ext_complex_get_substmt
                                          (LY_STMT_REVISION,
                                           (lys_ext_instance_complex *)local_50[local_48],
                                           (lyext_substmt **)0x0);
              plVar20 = local_40;
              if ((plVar15 != (long *)0x0) && (plVar25 = (long *)*plVar15, plVar25 != (long *)0x0))
              {
                if ((uint)*(LY_STMT *)(puVar1 + 0x10) < 2) {
                  if (local_34[0] == 0) {
                    local_34[0] = 1;
                    ly_print(local_40,">\n");
                  }
                  content_00 = (int *)0x17d028;
                  yin_print_revision(plVar20,local_38,local_58,(lys_revision *)*plVar15);
                }
                else {
                  lVar19 = *plVar25;
                  while (local_40 = plVar20, lVar19 != 0) {
                    if (local_34[0] == 0) {
                      local_34[0] = 1;
                      ly_print(plVar20,">\n");
                    }
                    content_00 = (int *)0x17c4f9;
                    yin_print_revision(plVar20,local_38,local_58,(lys_revision *)*plVar25);
                    lVar19 = plVar25[1];
                    plVar25 = plVar25 + 1;
                    plVar20 = local_40;
                  }
                }
              }
            }
switchD_0017b972_caseD_13:
            local_b8 = local_b8 + 1;
          } while( true );
        }
switchD_0017b972_caseD_0:
        uVar8 = local_48;
        ext = local_50;
        yin_print_close(local_40,(int)local_a0,local_98,local_50[local_48]->def->name,local_34[0]);
        uVar24 = (ulong)local_a4;
        uVar13 = local_90;
        local_48 = uVar8;
        substmt = local_74;
      }
LAB_0017d42d:
      local_48 = local_48 + 1;
    } while (local_48 != uVar13);
  }
  return;
}

Assistant:

static void
yin_print_extension_instances(struct lyout *out, int level, const struct lys_module *module,
                              LYEXT_SUBSTMT substmt, uint8_t substmt_index,
                              struct lys_ext_instance **ext, unsigned int count)
{
    unsigned int u, x;
    struct lys_module *mod;
    const char *prefix = NULL;
    struct lyext_substmt *info;
    int content, content2, i, j, c;
    uint16_t *flags;
    const char *str;
    void **pp, *p;
    struct lys_node *siter;

#define YIN_PRINT_EXTCOMPLEX_SNODE(STMT)                                                      \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    LY_TREE_FOR((struct lys_node*)(*pp), siter) {                                             \
        if (lys_snode2stmt(siter->nodetype) == STMT) {                                        \
            yin_print_close_parent(out, &content);                                            \
            yin_print_snode(out, level, siter, LYS_ANY);                                      \
        }                                                                                     \
    }
#define YIN_PRINT_EXTCOMPLEX_STRUCT(STMT, TYPE, FUNC)                                         \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)ext[u], NULL);  \
    if (!pp || !(*pp)) { break; }                                                             \
    if (info[i].cardinality >= LY_STMT_CARD_SOME) { /* process array */                       \
        for (pp = *pp; *pp; pp++) {                                                           \
            yin_print_close_parent(out, &content);                                            \
            FUNC(out, level, (TYPE *)(*pp));                                                  \
        }                                                                                     \
    }